

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setIntegerProperty
          (CommonCore *this,LocalFederateId federateID,int32_t property,int16_t propertyValue)

{
  bool bVar1;
  FederateState *this_00;
  FunctionExecutionFailure *this_01;
  pointer_____offset_0x10___ *ppuVar2;
  string_view message;
  string_view message_00;
  ActionMessage cmd;
  
  cmd.messageID = property;
  if (federateID.fid == -0x103) {
    bVar1 = waitCoreRegistration(this);
    if (!bVar1) {
      this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
      message._M_str = "core is unable to register and has timed out, property was not set";
      message._M_len = 0x42;
      FunctionExecutionFailure::FunctionExecutionFailure(this_01,message);
      ppuVar2 = &FunctionExecutionFailure::typeinfo;
LAB_00283b4c:
      __cxa_throw(this_01,ppuVar2,HelicsException::~HelicsException);
    }
    ActionMessage::ActionMessage(&cmd,cmd_core_configure);
    cmd.dest_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
    cmd.dest_handle.hid = (BaseType)propertyValue;
    BrokerBase::addActionMessage(&this->super_BrokerBase,&cmd);
  }
  else {
    this_00 = getFederateAt(this,federateID);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
      message_00._M_str = "federateID not valid (getMaximumIterations)";
      message_00._M_len = 0x2b;
      InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message_00);
      ppuVar2 = &InvalidIdentifier::typeinfo;
      goto LAB_00283b4c;
    }
    ActionMessage::ActionMessage(&cmd,cmd_fed_configure_int);
    cmd.dest_handle.hid = (BaseType)propertyValue;
    FederateState::setProperties(this_00,&cmd);
  }
  ActionMessage::~ActionMessage(&cmd);
  return;
}

Assistant:

void CommonCore::setIntegerProperty(LocalFederateId federateID,
                                    int32_t property,
                                    int16_t propertyValue)
{
    if (federateID == gLocalCoreId) {
        if (!waitCoreRegistration()) {
            throw(FunctionExecutionFailure(
                "core is unable to register and has timed out, property was not set"));
        }
        ActionMessage cmd(CMD_CORE_CONFIGURE);
        cmd.dest_id = global_id.load();
        cmd.messageID = property;
        cmd.setExtraData(propertyValue);
        addActionMessage(cmd);
        return;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (getMaximumIterations)"));
    }
    ActionMessage cmd(CMD_FED_CONFIGURE_INT);
    cmd.messageID = property;
    cmd.setExtraData(propertyValue);
    fed->setProperties(cmd);
}